

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O0

void reallymarkobject(global_State *g,GCObject *o)

{
  long *plVar1;
  Udata *iu;
  TValue *io;
  TValue uvalue;
  GCObject *o_local;
  global_State *g_local;
  
  uvalue._8_8_ = o;
LAB_0011f310:
  *(byte *)(uvalue._8_8_ + 9) = *(byte *)(uvalue._8_8_ + 9) & 0xfc;
  switch(*(undefined1 *)(uvalue._8_8_ + 8)) {
  case 4:
    *(byte *)(uvalue._8_8_ + 9) = *(byte *)(uvalue._8_8_ + 9) | 4;
    g->GCmemtrav = (long)(int)(*(byte *)(uvalue._8_8_ + 0xb) + 1) + 0x18 + g->GCmemtrav;
    return;
  case 5:
    *(GCObject **)(uvalue._8_8_ + 0x30) = g->gray;
    g->gray = (GCObject *)uvalue._8_8_;
    return;
  case 6:
    *(GCObject **)(uvalue._8_8_ + 0x10) = g->gray;
    g->gray = (GCObject *)uvalue._8_8_;
    return;
  case 7:
    break;
  case 8:
    *(GCObject **)(uvalue._8_8_ + 0x48) = g->gray;
    g->gray = (GCObject *)uvalue._8_8_;
    return;
  case 9:
    *(GCObject **)(uvalue._8_8_ + 0x70) = g->gray;
    g->gray = (GCObject *)uvalue._8_8_;
    return;
  default:
    return;
  case 0x14:
    *(byte *)(uvalue._8_8_ + 9) = *(byte *)(uvalue._8_8_ + 9) | 4;
    g->GCmemtrav = *(long *)(uvalue._8_8_ + 0x10) + 0x19 + g->GCmemtrav;
    return;
  case 0x26:
    *(GCObject **)(uvalue._8_8_ + 0x10) = g->gray;
    g->gray = (GCObject *)uvalue._8_8_;
    return;
  }
  if ((*(long *)(uvalue._8_8_ + 0x10) != 0) &&
     ((*(byte *)(*(long *)(uvalue._8_8_ + 0x10) + 9) & 3) != 0)) {
    reallymarkobject(g,*(GCObject **)(uvalue._8_8_ + 0x10));
  }
  *(byte *)(uvalue._8_8_ + 9) = *(byte *)(uvalue._8_8_ + 9) | 4;
  g->GCmemtrav = *(long *)(uvalue._8_8_ + 0x18) + 0x28 + g->GCmemtrav;
  plVar1 = (long *)(uvalue._8_8_ + 0x20);
  if ((*(byte *)(uvalue._8_8_ + 10) & 0x40) == 0) {
    return;
  }
  uvalue._8_8_ = *plVar1;
  if ((*(byte *)(*plVar1 + 9) & 3) == 0) {
    return;
  }
  goto LAB_0011f310;
}

Assistant:

static void reallymarkobject (global_State *g, GCObject *o) {
  white2gray(o);
  switch (o->tt) {
    case LUA_VSHRSTR:
    case LUA_VLNGSTR: {
      gray2black(o);
      break;
    }
    case LUA_VUPVAL: {
      UpVal *uv = gco2upv(o);
      if (!upisopen(uv))  /* open upvalues are kept gray */
        gray2black(o);
      markvalue(g, uv->v);  /* mark its content */
      break;
    }
    case LUA_VUSERDATA: {
      Udata *u = gco2u(o);
      if (u->nuvalue == 0) {  /* no user values? */
        markobjectN(g, u->metatable);  /* mark its metatable */
        gray2black(o);  /* nothing else to mark */
        break;
      }
      /* else... */
    }  /* FALLTHROUGH */
    case LUA_VLCL: case LUA_VCCL: case LUA_VTABLE:
    case LUA_VTHREAD: case LUA_VPROTO: {
      linkobjgclist(o, g->gray);
      break;
    }
    default: lua_assert(0); break;
  }
}